

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader-test.cc
# Opt level: O0

void __thiscall TextReaderTest_ReportError_Test::TestBody(TextReaderTest_ReportError_Test *this)

{
  NLStringRef data;
  undefined1 uVar1;
  bool bVar2;
  ReadError *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  TextReader reader;
  char *in_stack_fffffffffffffec8;
  TextReader<fmt::Locale> *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffee0;
  int in_stack_fffffffffffffeec;
  char *in_stack_fffffffffffffef0;
  undefined4 in_stack_fffffffffffffef8;
  Type in_stack_fffffffffffffefc;
  CStringRef in_stack_ffffffffffffff00;
  undefined7 in_stack_ffffffffffffff08;
  undefined1 in_stack_ffffffffffffff0f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff10;
  BasicCStringRef<char> local_c8;
  byte local_ba;
  allocator<char> local_b9;
  Message *in_stack_ffffffffffffff48;
  AssertHelper *in_stack_ffffffffffffff50;
  AssertionResult local_88;
  BasicCStringRef<char> local_78 [15];
  
  mp::NLStringRef::NLStringRef((NLStringRef *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
  fmt::BasicCStringRef<char>::BasicCStringRef(local_78,"test");
  data.data_._7_1_ = in_stack_ffffffffffffff0f;
  data.data_._0_7_ = in_stack_ffffffffffffff08;
  data.size_ = (size_t)in_stack_ffffffffffffff10;
  mp::internal::TextReader<fmt::Locale>::TextReader
            ((TextReader<fmt::Locale> *)
             CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),data,
             in_stack_ffffffffffffff00);
  testing::AssertionSuccess();
  uVar1 = testing::AssertionResult::operator_cast_to_bool(&local_88);
  if ((bool)uVar1) {
    in_stack_ffffffffffffff00.data_ = (char *)&local_b9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff10,(char *)CONCAT17(uVar1,in_stack_ffffffffffffff08),
               (allocator<char> *)in_stack_ffffffffffffff00.data_);
    std::allocator<char>::~allocator(&local_b9);
    local_ba = 0;
    bVar2 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffffefc = CONCAT13(bVar2,(int3)in_stack_fffffffffffffefc);
    if (bVar2) {
      fmt::BasicCStringRef<char>::BasicCStringRef(&local_c8,"a{}c");
      mp::internal::TextReader<fmt::Locale>::ReportError<char>
                ((TextReader<fmt::Locale> *)
                 CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                 in_stack_ffffffffffffff00,in_stack_fffffffffffffef0);
    }
    bVar2 = (local_ba & 1) != 0;
    if (!bVar2) {
      testing::AssertionResult::operator<<
                ((AssertionResult *)in_stack_ffffffffffffff00.data_,
                 (char (*) [114])CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    }
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff48);
    if (bVar2) goto LAB_0013c4a6;
  }
  testing::Message::Message((Message *)in_stack_ffffffffffffff00.data_);
  testing::AssertionResult::failure_message((AssertionResult *)0x13c418);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_ffffffffffffff00.data_,in_stack_fffffffffffffefc,
             in_stack_fffffffffffffef0,in_stack_fffffffffffffeec,in_stack_fffffffffffffee0);
  testing::internal::AssertHelper::operator=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffed0);
  testing::Message::~Message((Message *)0x13c464);
LAB_0013c4a6:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13c4b3);
  mp::internal::TextReader<fmt::Locale>::~TextReader(in_stack_fffffffffffffed0);
  return;
}

Assistant:

TEST(TextReaderTest, ReportError) {
  TextReader reader("x\n", "test");
  EXPECT_THROW_MSG(reader.ReportError("a{}c", 'b'), mp::ReadError,
                   "test:1:1: abc");
}